

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satTruth.c
# Opt level: O3

Tru_Man_t * Tru_ManAlloc(int nVars)

{
  uint uVar1;
  int iVar2;
  Tru_Man_t *p;
  int *piVar3;
  Vec_Set_t *pVVar4;
  word **ppwVar5;
  word *pwVar6;
  long lVar7;
  ulong uVar8;
  word local_58 [6];
  
  local_58[0] = 0xaaaaaaaaaaaaaaaa;
  local_58[1] = 0xcccccccccccccccc;
  local_58[2] = 0xf0f0f0f0f0f0f0f0;
  local_58[3] = 0xff00ff00ff00ff00;
  local_58[4] = 0xffff0000ffff0000;
  local_58[5] = 0xffffffff00000000;
  if (0xf < nVars - 1U) {
    __assert_fail("nVars > 0 && nVars <= 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satTruth.c"
                  ,0xd3,"Tru_Man_t *Tru_ManAlloc(int)");
  }
  uVar1 = 1 << ((char)nVars - 6U & 0x1f);
  if ((uint)nVars < 6) {
    uVar1 = 1;
  }
  p = (Tru_Man_t *)calloc(1,0x70);
  p->nVars = nVars;
  p->nWords = uVar1;
  p->nEntrySize = (int)((ulong)uVar1 * 8 + 8 >> 2);
  p->nTableSize = 0x1fd3;
  piVar3 = (int *)calloc(0x1fd3,4);
  p->pTable = piVar3;
  pVVar4 = (Vec_Set_t *)calloc(1,0x20);
  pVVar4->nPageSize = 0x10;
  pVVar4->uPageMask = 0xffff;
  pVVar4->nPagesAlloc = 0x100;
  ppwVar5 = (word **)calloc(0x100,8);
  pVVar4->pPages = ppwVar5;
  pwVar6 = (word *)malloc(0x80000);
  *ppwVar5 = pwVar6;
  pwVar6[1] = 0xffffffffffffffff;
  *pwVar6 = 2;
  p->pMem = pVVar4;
  pwVar6 = (word *)malloc((ulong)uVar1 << 3);
  p->pZero = pwVar6;
  uVar8 = 0;
  while( true ) {
    iVar2 = p->nWords;
    if ((long)iVar2 < 1) {
      pwVar6 = p->pZero;
    }
    else {
      lVar7 = 0;
      do {
        if (uVar8 < 6) {
          pwVar6 = p->pZero;
          pwVar6[lVar7] = local_58[uVar8];
        }
        else {
          pwVar6 = p->pZero;
          if ((1 << ((char)uVar8 - 6U & 0x1f) & (uint)lVar7) == 0) {
            pwVar6[lVar7] = 0;
          }
          else {
            pwVar6[lVar7] = 0xffffffffffffffff;
          }
        }
        lVar7 = lVar7 + 1;
      } while (iVar2 != lVar7);
    }
    iVar2 = Tru_ManInsert(p,pwVar6);
    p->hIthVars[uVar8] = iVar2;
    if ((uVar8 != 0) && (iVar2 <= p->hIthVars[uVar8 - 1])) break;
    uVar8 = uVar8 + 1;
    if (uVar8 == (uint)nVars) {
      if (0 < (long)p->nWords) {
        memset(p->pZero,0,(long)p->nWords << 3);
      }
      return p;
    }
  }
  __assert_fail("!i || p->hIthVars[i] > p->hIthVars[i-1]",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satTruth.c"
                ,0xe7,"Tru_Man_t *Tru_ManAlloc(int)");
}

Assistant:

Tru_Man_t * Tru_ManAlloc( int nVars )
{
    word Masks[6] = 
    { 
        ABC_CONST(0xAAAAAAAAAAAAAAAA), 
        ABC_CONST(0xCCCCCCCCCCCCCCCC), 
        ABC_CONST(0xF0F0F0F0F0F0F0F0), 
        ABC_CONST(0xFF00FF00FF00FF00), 
        ABC_CONST(0xFFFF0000FFFF0000), 
        ABC_CONST(0xFFFFFFFF00000000) 
    };
    Tru_Man_t * p;
    int i, w;
    assert( nVars > 0 && nVars <= 16 );
    p = ABC_CALLOC( Tru_Man_t, 1 );
    p->nVars      = nVars;
    p->nWords     = (nVars < 6) ? 1 : (1 << (nVars-6));
    p->nEntrySize = (sizeof(Tru_One_t) + p->nWords * sizeof(word))/sizeof(int);
    p->nTableSize = 8147;
    p->pTable     = ABC_CALLOC( int, p->nTableSize );
    p->pMem       = Vec_SetAlloc( 16 );
    // initialize truth tables
    p->pZero = ABC_ALLOC( word, p->nWords );
    for ( i = 0; i < nVars; i++ )
    {
        for ( w = 0; w < p->nWords; w++ )
            if ( i < 6 )
                p->pZero[w] = Masks[i];
            else if ( w & (1 << (i-6)) )
                p->pZero[w] = ~(word)0;
            else
                p->pZero[w] = 0;
        p->hIthVars[i] = Tru_ManInsert( p, p->pZero );
        assert( !i || p->hIthVars[i] > p->hIthVars[i-1] );
    }
    Tru_ManClear( p->pZero, p->nWords );
    return p;
}